

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O0

void __thiscall Assimp::D3DS::Texture::Texture(Texture *this)

{
  ai_real aVar1;
  Texture *this_local;
  
  std::__cxx11::string::string((string *)&this->mMapName);
  this->mOffsetU = 0.0;
  this->mOffsetV = 0.0;
  this->mScaleU = 1.0;
  this->mScaleV = 1.0;
  this->mRotation = 0.0;
  this->mMapMode = aiTextureMapMode_Wrap;
  this->bPrivate = false;
  this->iUVSrc = 0;
  aVar1 = get_qnan();
  this->mTextureBlend = aVar1;
  return;
}

Assistant:

Texture() AI_NO_EXCEPT
    : mOffsetU  (0.0)
    , mOffsetV  (0.0)
    , mScaleU   (1.0)
    , mScaleV   (1.0)
    , mRotation (0.0)
    , mMapMode  (aiTextureMapMode_Wrap)
    , bPrivate()
    , iUVSrc    (0) {
        mTextureBlend = get_qnan();
    }